

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O2

ion_err_t ion_master_table_create_dictionary
                    (ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                    ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size,
                    ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  ion_dictionary_id_t id;
  ion_dictionary_id_t local_34;
  
  iVar1 = ion_master_table_get_next_id(&local_34);
  if (iVar1 == '\0') {
    iVar1 = dictionary_create(handler,dictionary,local_34,key_type,key_size,value_size,
                              dictionary_size);
    if (iVar1 == '\0') {
      iVar1 = ion_add_to_master_table(dictionary,dictionary_size);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
ion_master_table_create_dictionary(
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size
) {
	ion_err_t			err;
	ion_dictionary_id_t id;

	err = ion_master_table_get_next_id(&id);

	if (err_ok != err) {
		return err;
	}

	err = dictionary_create(handler, dictionary, id, key_type, key_size, value_size, dictionary_size);

	if (err_ok != err) {
		return err;
	}

	err = ion_add_to_master_table(dictionary, dictionary_size);

	return err;
}